

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

void ixmlNode_getElementsByTagNameNSRecursive
               (IXML_Node_conflict *n,char *namespaceURI,char *localName,IXML_NodeList **list)

{
  char *__s1;
  int iVar1;
  
  do {
    if (n == (IXML_Node_conflict *)0x0) {
      return;
    }
    if ((short)n->nodeType == eELEMENT_NODE) {
      __s1 = n->localName;
      if (n->namespaceURI != (char *)0x0 && __s1 != (char *)0x0) {
        iVar1 = strcmp(namespaceURI,n->namespaceURI);
        if (iVar1 != 0) {
          iVar1 = strcmp(namespaceURI,"*");
          if (iVar1 != 0) goto LAB_001083a8;
        }
        iVar1 = strcmp(__s1,localName);
        if (iVar1 != 0) {
          iVar1 = strcmp(localName,"*");
          if (iVar1 != 0) goto LAB_001083a8;
        }
        ixmlNodeList_addToNodeList(list,n);
      }
    }
LAB_001083a8:
    ixmlNode_getElementsByTagNameNSRecursive(n->firstChild,namespaceURI,localName,list);
    n = n->nextSibling;
  } while( true );
}

Assistant:

static void ixmlNode_getElementsByTagNameNSRecursive(
	/*! [in] . */
	IXML_Node *n,
	/*! [in] . */
	const char *namespaceURI,
	/*! [in] . */
	const char *localName,
	/*! [out] . */
	IXML_NodeList **list)
{
	const DOMString nsURI;
	const DOMString name;

	if (n != NULL) {
		if (ixmlNode_getNodeType(n) == eELEMENT_NODE) {
			name = ixmlNode_getLocalName(n);
			nsURI = ixmlNode_getNamespaceURI(n);

			if (name != NULL && nsURI != NULL &&
				(strcmp(namespaceURI, nsURI) == 0 ||
					strcmp(namespaceURI, "*") == 0) &&
				(strcmp(name, localName) == 0 ||
					strcmp(localName, "*") == 0)) {
				ixmlNodeList_addToNodeList(list, n);
			}
		}
		ixmlNode_getElementsByTagNameNSRecursive(
			ixmlNode_getFirstChild(n),
			namespaceURI,
			localName,
			list);
		ixmlNode_getElementsByTagNameNSRecursive(
			ixmlNode_getNextSibling(n),
			namespaceURI,
			localName,
			list);
	}
}